

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O3

bool __thiscall cmsys::Directory::Load(Directory *this,string *name)

{
  DirectoryInternals *this_00;
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::resize((ulong)&this->Internal->Path,'\0');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->Internal->Files,
                    (this->Internal->Files).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  __dirp = opendir((name->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar1 = readdir(__dirp);
    if (pdVar1 != (dirent *)0x0) {
      do {
        this_00 = this->Internal;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar2 = strlen(pdVar1->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pdVar1->d_name,pdVar1->d_name + sVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pdVar1 = readdir(__dirp);
      } while (pdVar1 != (dirent *)0x0);
    }
    std::__cxx11::string::_M_assign((string *)&this->Internal->Path);
    closedir(__dirp);
  }
  return __dirp != (DIR *)0x0;
}

Assistant:

bool Directory::Load(const std::string& name)
{
  this->Clear();

  DIR* dir = opendir(name.c_str());

  if (!dir) {
    return 0;
  }

  for (kwsys_dirent* d = readdir(dir); d; d = readdir(dir)) {
    this->Internal->Files.push_back(d->d_name);
  }
  this->Internal->Path = name;
  closedir(dir);
  return 1;
}